

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

void __thiscall HMISong::ProcessInitialMetaEvents(HMISong *this)

{
  TrackInfo *pTVar1;
  BYTE BVar2;
  TrackInfo *pTVar3;
  BYTE *pBVar4;
  size_t sVar5;
  DWORD DVar6;
  ulong uVar7;
  long lVar8;
  
  if (0 < this->NumTracks) {
    lVar8 = 0;
    do {
      pTVar3 = this->Tracks;
      pTVar1 = pTVar3 + lVar8;
      uVar7 = pTVar3[lVar8].TrackP;
      if (pTVar3[lVar8].Finished == false) {
        do {
          if (((pTVar1->MaxTrackP - 4 <= uVar7) ||
              (pBVar4 = pTVar1->TrackBegin, pBVar4[uVar7] != '\0')) || (pBVar4[uVar7 + 1] != 0xff))
          break;
          BVar2 = pBVar4[uVar7 + 2];
          pTVar1->TrackP = uVar7 + 3;
          DVar6 = (*this->ReadVarLen)(pTVar1);
          sVar5 = pTVar1->TrackP;
          uVar7 = sVar5 + DVar6;
          if (uVar7 <= pTVar1->MaxTrackP) {
            if (BVar2 == 'Q') {
              pBVar4 = pTVar1->TrackBegin;
              MIDIStreamer::SetTempo
                        (&this->super_MIDIStreamer,
                         (uint)pBVar4[sVar5 + 2] |
                         (uint)pBVar4[sVar5 + 1] << 8 | (uint)pBVar4[sVar5] << 0x10);
              uVar7 = (ulong)DVar6 + pTVar1->TrackP;
            }
            else if (BVar2 == '/') {
              pTVar1->Finished = true;
            }
          }
          pTVar1->TrackP = uVar7;
        } while (pTVar1->Finished != true);
      }
      if (pTVar1->MaxTrackP - 4 <= uVar7) {
        pTVar1->Finished = true;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->NumTracks);
  }
  return;
}

Assistant:

void HMISong::ProcessInitialMetaEvents ()
{
	TrackInfo *track;
	int i;
	BYTE event;
	DWORD len;

	for (i = 0; i < NumTracks; ++i)
	{
		track = &Tracks[i];
		while (!track->Finished &&
				track->TrackP < track->MaxTrackP - 4 &&
				track->TrackBegin[track->TrackP] == 0 &&
				track->TrackBegin[track->TrackP+1] == 0xFF)
		{
			event = track->TrackBegin[track->TrackP+2];
			track->TrackP += 3;
			len = ReadVarLen(track);
			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					SetTempo(
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2])
					);
					break;
				}
			}
			track->TrackP += len;
		}
		if (track->TrackP >= track->MaxTrackP - 4)
		{
			track->Finished = true;
		}
	}
}